

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic-sensor.cpp
# Opt level: O2

Vector __thiscall
stateObservation::AlgebraicSensor::getMeasurements(AlgebraicSensor *this,bool noisy)

{
  Matrix<double,__1,_1,_0,__1,_1> *__ptr;
  NoiseBase *pNVar1;
  int in_EDX;
  Index extraout_RDX;
  undefined7 in_register_00000031;
  long *plVar2;
  long *plVar3;
  Vector VVar4;
  long lStack_60;
  Matrix<double,__1,_1,_0,__1,_1> *local_58 [2];
  Matrix<double,__1,_1,_0,__1,_1> *local_48;
  NoiseBase *local_40;
  
  plVar2 = (long *)CONCAT71(in_register_00000031,noisy);
  if ((in_EDX == 0) || (plVar2[1] == 0)) {
    if ((char)plVar2[10] != '\0') {
      lStack_60 = 0x58;
      goto LAB_001e1493;
    }
    plVar3 = plVar2 + 10;
    if (*(int *)((long)plVar2 + 0x14) == 0) {
      (**(code **)(*plVar2 + 0x68))(&stack0xffffffffffffffb8,plVar2);
      local_58[0] = (Matrix<double,__1,_1,_0,__1,_1> *)plVar2[0xb];
      plVar2[0xb] = (long)local_48;
      pNVar1 = (NoiseBase *)plVar2[0xc];
      plVar2[0xc] = (long)local_40;
      local_48 = local_58[0];
      local_40 = pNVar1;
    }
    else {
      (**(code **)(*plVar2 + 0x68))(local_58,plVar2);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
      CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&stack0xffffffffffffffb8,
                 (Matrix<double,__1,_1,_0,__1,_1> *)(plVar2 + 0xb),
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&stack0xffffffffffffffb8,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(plVar2 + 5));
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 &stack0xffffffffffffffb8);
    }
    free(local_58[0]);
    lStack_60 = 0x58;
  }
  else {
    if ((char)plVar2[7] != '\0') {
      lStack_60 = 0x40;
      goto LAB_001e1493;
    }
    plVar3 = plVar2 + 7;
    computeNoisyMeasurement_((AlgebraicSensor *)&stack0xffffffffffffffb8);
    __ptr = (Matrix<double,__1,_1,_0,__1,_1> *)plVar2[8];
    plVar2[8] = (long)local_48;
    pNVar1 = (NoiseBase *)plVar2[9];
    plVar2[9] = (long)local_40;
    local_48 = __ptr;
    local_40 = pNVar1;
    free(__ptr);
    lStack_60 = 0x40;
  }
  *(undefined1 *)plVar3 = 1;
LAB_001e1493:
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,
             (DenseStorage<double,__1,__1,_1,_0> *)((long)plVar2 + lStack_60));
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector AlgebraicSensor::getMeasurements(bool noisy)
    {
        if (noisy && noise_!=0x0)
        {
            if (!storedNoisyMeasurement_)
            {
                noisyMeasurement_ =  computeNoisyMeasurement_();
                storedNoisyMeasurement_=true;
            }
            return noisyMeasurement_;
        }
        else
        {
            if (!storedNoiselessMeasurement_)
            {
                if (concat_>0)
                  noiselessMeasurement_<< computeNoiselessMeasurement_() ,directInputToOutput_;
                else
                  noiselessMeasurement_= computeNoiselessMeasurement_();

                storedNoiselessMeasurement_=true;
            }
            return noiselessMeasurement_;
        }
    }